

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_sorted_dup_node_clean(lyxp_set *set)

{
  int local_18;
  uint local_14;
  int ret;
  uint32_t i;
  lyxp_set *set_local;
  
  local_14 = 0;
  local_18 = 0;
  if (1 < set->used) {
    while (local_14 < set->used - 1) {
      if (((set->val).nodes[local_14].node == (set->val).nodes[local_14 + 1].node) &&
         ((set->val).nodes[local_14].type == (set->val).nodes[local_14 + 1].type)) {
        set_remove_node(set,local_14 + 1);
        local_18 = 1;
      }
      else {
        local_14 = local_14 + 1;
      }
    }
  }
  return local_18;
}

Assistant:

static int
set_sorted_dup_node_clean(struct lyxp_set *set)
{
    uint32_t i = 0;
    int ret = EXIT_SUCCESS;

    if (set->used > 1) {
        while (i < set->used - 1) {
            if ((set->val.nodes[i].node == set->val.nodes[i + 1].node)
                    && (set->val.nodes[i].type == set->val.nodes[i + 1].type)) {
                set_remove_node(set, i + 1);
            ret = EXIT_FAILURE;
            } else {
                ++i;
            }
        }
    }

    return ret;
}